

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,cmGeneratorTarget *target,char *filename)

{
  cmOutputConverter *this_00;
  cmMakefile *this_01;
  string *psVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  string_view str;
  string_view source;
  string_view separator;
  string fc;
  cmAlphaNum local_320;
  string remove;
  string cleanfile;
  string local_290;
  string local_270;
  string currentBinDir;
  ofstream fout;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&currentBinDir,(string *)psVar1);
  fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)currentBinDir._M_string_length;
  fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = currentBinDir._M_dataplus._M_p;
  fc._M_string_length = (size_type)&fc.field_2;
  fc._M_dataplus._M_p = (pointer)0x1;
  fc.field_2._M_local_buf[0] = 0x2f;
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
            (&local_320,this,target);
  pcVar4 = "/cmake_clean";
  cmStrCat<std::__cxx11::string,char[13]>
            (&cleanfile,(cmAlphaNum *)&fout,(cmAlphaNum *)&fc,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320,
             (char (*) [13])"/cmake_clean");
  std::__cxx11::string::~string((string *)&local_320);
  if (filename != (char *)0x0) {
    std::__cxx11::string::append((char *)&cleanfile);
    std::__cxx11::string::append((char *)&cleanfile);
  }
  std::__cxx11::string::append((char *)&cleanfile);
  std::ofstream::ofstream(&fout,cleanfile._M_dataplus._M_p,_S_out);
  if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
      != 0) {
    std::operator+(&fc,"Could not create ",&cleanfile);
    cmSystemTools::Error(&fc);
    std::__cxx11::string::~string((string *)&fc);
  }
  if ((files->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"file(REMOVE_RECURSE\n"
                   );
    for (p_Var3 = (files->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(files->_M_t)._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      cmOutputConverter::MaybeRelativeToCurBinDir
                (&fc,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,(string *)(p_Var3 + 1));
      poVar2 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"  ");
      str._M_str = (char *)0x0;
      str._M_len = (size_t)fc._M_dataplus._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)&local_320,(cmOutputConverter *)fc._M_string_length,str,
                 (WrapQuotes)pcVar4);
      poVar2 = std::operator<<(poVar2,(string *)&local_320);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&fc);
    }
    std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,")\n");
  }
  fc._M_dataplus._M_p = (pointer)0x14;
  fc._M_string_length = (size_type)anon_var_dwarf_10f2849;
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::MaybeRelativeToCurBinDir(&local_290,this_00,&cleanfile);
  source._M_str = local_290._M_dataplus._M_p;
  source._M_len = local_290._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_270,this_00,source,SHELL);
  local_320.View_._M_len = local_270._M_string_length;
  local_320.View_._M_str = local_270._M_dataplus._M_p;
  cmStrCat<>(&remove,(cmAlphaNum *)&fc,&local_320);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,&remove);
  std::__cxx11::string::~string((string *)&remove);
  if (filename == (char *)0x0) {
    fc.field_2._8_8_ = &fc._M_string_length;
    fc._M_string_length = fc._M_string_length & 0xffffffff00000000;
    fc.field_2._M_allocated_capacity = 0;
    this_01 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"CMAKE_BUILD_TYPE",(allocator<char> *)&remove);
    psVar1 = cmMakefile::GetSafeDefinition(this_01,(string *)&local_320);
    cmGeneratorTarget::GetLanguages
              (target,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&fc,psVar1);
    std::__cxx11::string::~string((string *)&local_320);
    poVar2 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    poVar2 = std::operator<<(poVar2,"# Per-language clean rules from dependency scanning.\n");
    poVar2 = std::operator<<(poVar2,"foreach(lang ");
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((string *)&local_320,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&fc,separator);
    poVar2 = std::operator<<(poVar2,(string *)&local_320);
    poVar2 = std::operator<<(poVar2,")\n");
    poVar2 = std::operator<<(poVar2,"  include(");
    (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
              (&remove,this,target);
    poVar2 = std::operator<<(poVar2,(string *)&remove);
    poVar2 = std::operator<<(poVar2,"/cmake_clean_${lang}.cmake OPTIONAL)\n");
    std::operator<<(poVar2,"endforeach()\n");
    std::__cxx11::string::~string((string *)&remove);
    std::__cxx11::string::~string((string *)&local_320);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&fc);
  }
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&cleanfile);
  std::__cxx11::string::~string((string *)&currentBinDir);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCleanCommand(
  std::vector<std::string>& commands, const std::set<std::string>& files,
  cmGeneratorTarget* target, const char* filename)
{
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile = cmStrCat(
    currentBinDir, '/', this->GetTargetDirectory(target), "/cmake_clean");
  if (filename) {
    cleanfile += "_";
    cleanfile += filename;
  }
  cleanfile += ".cmake";
  cmsys::ofstream fout(cleanfile.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not create " + cleanfile);
  }
  if (!files.empty()) {
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& file : files) {
      std::string fc = this->MaybeRelativeToCurBinDir(file);
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  {
    std::string remove = cmStrCat(
      "$(CMAKE_COMMAND) -P ",
      this->ConvertToOutputFormat(this->MaybeRelativeToCurBinDir(cleanfile),
                                  cmOutputConverter::SHELL));
    commands.push_back(std::move(remove));
  }

  // For the main clean rule add per-language cleaning.
  if (!filename) {
    // Get the set of source languages in the target.
    std::set<std::string> languages;
    target->GetLanguages(
      languages, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    /* clang-format off */
    fout << "\n"
         << "# Per-language clean rules from dependency scanning.\n"
         << "foreach(lang " << cmJoin(languages, " ") << ")\n"
         << "  include(" << this->GetTargetDirectory(target)
         << "/cmake_clean_${lang}.cmake OPTIONAL)\n"
         << "endforeach()\n";
    /* clang-format on */
  }
}